

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cencode.c
# Opt level: O2

size_t rcnb_encode(char *plaintext_in,size_t length_in,wchar_t *code_out)

{
  size_t sVar1;
  size_t sVar2;
  rcnb_encodestate es;
  rcnb_encodestate local_1a;
  
  local_1a.cached = false;
  sVar1 = rcnb_encode_block(plaintext_in,length_in,code_out,&local_1a);
  sVar2 = rcnb_encode_blockend(code_out + sVar1,&local_1a);
  return sVar2 + sVar1;
}

Assistant:

size_t rcnb_encode(const char* plaintext_in, size_t length_in, wchar_t* code_out)
{
    rcnb_encodestate es;
    rcnb_init_encodestate(&es);
    size_t output_size = 0;
    output_size += rcnb_encode_block(plaintext_in, length_in, code_out, &es);
    output_size += rcnb_encode_blockend(code_out + output_size, &es);
    return output_size;
}